

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

ResultBuilder * __thiscall
Catch::ResultBuilder::reconstructExpression_abi_cxx11_(ResultBuilder *this)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  long in_RSI;
  string local_208 [32];
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  ResultBuilder *this_local;
  
  this_local = this;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (in_RSI + 0x100),"");
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RSI + 0x100));
    }
    else {
      std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x48));
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (in_RSI + 0x100),"matches");
    if (bVar1) {
      std::operator+(local_38,(char *)(in_RSI + 0xc0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     local_38);
      std::__cxx11::string::~string((string *)local_38);
    }
    else {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (in_RSI + 0x100),"!");
      if (bVar1) {
        lVar3 = std::__cxx11::string::size();
        lVar4 = std::__cxx11::string::size();
        if ((((ulong)(lVar3 + lVar4) < 0x28) &&
            (lVar3 = std::__cxx11::string::find((char *)(in_RSI + 0xc0),0x1d6b56), lVar3 == -1)) &&
           (lVar3 = std::__cxx11::string::find((char *)(in_RSI + 0xe0),0x1d6b56), lVar3 == -1)) {
          std::operator+(local_a8,(char *)(in_RSI + 0xc0));
          std::operator+(local_88,local_a8);
          std::operator+(local_68,(char *)local_88);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         local_68);
          std::__cxx11::string::~string((string *)local_68);
          std::__cxx11::string::~string((string *)local_88);
          std::__cxx11::string::~string((string *)local_a8);
        }
        else {
          std::operator+(local_108,(char *)(in_RSI + 0xc0));
          std::operator+(local_e8,local_108);
          std::operator+(local_c8,(char *)local_e8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         local_c8);
          std::__cxx11::string::~string((string *)local_c8);
          std::__cxx11::string::~string((string *)local_e8);
          std::__cxx11::string::~string((string *)local_108);
        }
      }
      else {
        std::operator+((char *)local_1e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "{can\'t expand - use ");
        std::operator+(local_1c8,(char *)local_1e8);
        std::__cxx11::string::substr((ulong)local_208,in_RSI + 0x48);
        std::operator+(local_1a8,local_1c8);
        std::operator+(local_188,(char *)local_1a8);
        std::operator+(local_168,local_188);
        std::operator+(local_148,(char *)local_168);
        std::operator+(local_128,local_148);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_128);
        std::__cxx11::string::~string((string *)local_128);
        std::__cxx11::string::~string((string *)local_148);
        std::__cxx11::string::~string((string *)local_168);
        std::__cxx11::string::~string((string *)local_188);
        std::__cxx11::string::~string((string *)local_1a8);
        std::__cxx11::string::~string(local_208);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::string::~string(local_1e8);
      }
    }
  }
  return this;
}

Assistant:

std::string ResultBuilder::reconstructExpression() const {
        if( m_exprComponents.op == "" )
            return m_exprComponents.lhs.empty() ? m_assertionInfo.capturedExpression : m_exprComponents.op + m_exprComponents.lhs;
        else if( m_exprComponents.op == "matches" )
            return m_exprComponents.lhs + " " + m_exprComponents.rhs;
        else if( m_exprComponents.op != "!" ) {
            if( m_exprComponents.lhs.size() + m_exprComponents.rhs.size() < 40 &&
                m_exprComponents.lhs.find("\n") == std::string::npos &&
                m_exprComponents.rhs.find("\n") == std::string::npos )
                return m_exprComponents.lhs + " " + m_exprComponents.op + " " + m_exprComponents.rhs;
            else
                return m_exprComponents.lhs + "\n" + m_exprComponents.op + "\n" + m_exprComponents.rhs;
        }
        else
            return "{can't expand - use " + m_assertionInfo.macroName + "_FALSE( " + m_assertionInfo.capturedExpression.substr(1) + " ) instead of " + m_assertionInfo.macroName + "( " + m_assertionInfo.capturedExpression + " ) for better diagnostics}";
    }